

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O3

Graph * Omega_h::invert_map_by_atomics
                  (Graph *__return_storage_ptr__,LOs *a2b,LO nb,string *b2ba_name,string *ba2a_name)

{
  size_type *psVar1;
  int *piVar2;
  int iVar3;
  void *pvVar4;
  undefined8 uVar5;
  LO i;
  string *name;
  void *pvVar6;
  Graph *this;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  Alloc ***pppAVar10;
  long *plVar11;
  long lVar12;
  Alloc **ppAVar13;
  long lVar14;
  Alloc *pAVar15;
  Alloc *pAVar16;
  ScopedTimer omega_h_scoped_function_timer;
  LOs ba2a;
  string __str;
  ScopedTimer omega_h_scoped_function_timer_2;
  type fill;
  LOs b2ba;
  Write<int> write_ba2a;
  Write<int> degrees;
  ScopedTimer omega_h_scoped_function_timer_1;
  Write<int> positions;
  type count;
  ScopedTimer local_201;
  undefined1 local_200 [32];
  Alloc *local_1e0;
  void *local_1d8;
  Alloc *local_1d0;
  Alloc *local_1c8;
  Alloc **local_1c0;
  Alloc *local_1b8;
  Alloc *local_1b0 [2];
  ScopedTimer local_199;
  Alloc ***local_198;
  Alloc **local_190;
  Alloc **local_188;
  long lStack_180;
  ulong local_178;
  Alloc *local_170;
  Alloc *local_168;
  void *local_160;
  undefined1 local_158 [56];
  Alloc *local_120;
  Alloc *local_118;
  string *local_110;
  Read<int> local_108;
  Write<int> local_f8;
  Write<int> local_e8;
  Alloc *local_d8;
  long local_d0;
  undefined1 local_c8 [24];
  undefined1 local_b0 [16];
  void *local_a0;
  Write<int> local_98;
  Write<int> local_88;
  Write<int> local_78;
  Alloc *local_68;
  void *local_60;
  Alloc *local_58;
  void *pvStack_50;
  Graph *local_48;
  Read<signed_char> local_40;
  
  local_198 = &local_188;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_198,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,"");
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_198);
  local_168 = (Alloc *)local_158;
  pAVar15 = (Alloc *)(plVar8 + 2);
  if ((Alloc *)*plVar8 == pAVar15) {
    local_158._0_8_ = pAVar15->size;
    local_158._8_8_ = plVar8[3];
  }
  else {
    local_158._0_8_ = pAVar15->size;
    local_168 = (Alloc *)*plVar8;
  }
  local_160 = (void *)plVar8[1];
  *plVar8 = (long)pAVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_1c0 = local_1b0;
  local_118 = (Alloc *)ba2a_name;
  std::__cxx11::string::_M_construct((ulong)&local_1c0,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1c0,3,0xf0);
  pAVar15 = (Alloc *)0xf;
  if (local_168 != (Alloc *)local_158) {
    pAVar15 = (Alloc *)local_158._0_8_;
  }
  if (pAVar15 < (Alloc *)((long)local_1b8 + (long)local_160)) {
    pAVar15 = (Alloc *)0xf;
    if (local_1c0 != local_1b0) {
      pAVar15 = local_1b0[0];
    }
    if (pAVar15 < (Alloc *)((long)local_1b8 + (long)local_160)) goto LAB_002fa46a;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_168);
  }
  else {
LAB_002fa46a:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_1c0);
  }
  local_200._0_8_ = local_200 + 0x10;
  psVar1 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar1) {
    local_200._16_8_ = *psVar1;
    local_200._24_8_ = puVar9[3];
  }
  else {
    local_200._16_8_ = *psVar1;
    local_200._0_8_ = (size_type *)*puVar9;
  }
  local_200._8_8_ = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(char *)psVar1 = '\0';
  local_110 = b2ba_name;
  begin_code("invert_map_by_atomics",(char *)local_200._0_8_);
  plVar8 = (long *)(local_200 + 0x10);
  if ((long *)local_200._0_8_ != plVar8) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,(ulong)((long)&local_1b0[0]->size + 1));
  }
  if (local_168 != (Alloc *)local_158) {
    operator_delete(local_168,(ulong)((long)(size_t *)local_158._0_8_ + 1));
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,(long)local_188 + 1);
  }
  pAVar15 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar15 & 1) == 0) {
    local_178 = pAVar15->size;
  }
  else {
    local_178 = (ulong)pAVar15 >> 3;
  }
  local_200._0_8_ = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"");
  Write<int>::Write(&local_e8,nb,0,(string *)local_200);
  if ((long *)local_200._0_8_ != plVar8) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  pvVar6 = local_e8.shared_alloc_.direct_ptr;
  local_68 = (a2b->write_).shared_alloc_.alloc;
  local_120 = (Alloc *)CONCAT44(local_120._4_4_,nb);
  if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68 = (Alloc *)(local_68->size * 8 + 1);
    }
    else {
      local_68->use_count = local_68->use_count + 1;
    }
  }
  pvVar4 = (a2b->write_).shared_alloc_.direct_ptr;
  local_58 = local_e8.shared_alloc_.alloc;
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_58 = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar15 = local_58;
  pvStack_50 = local_e8.shared_alloc_.direct_ptr;
  local_1c0 = (Alloc **)0x5d;
  local_198 = &local_188;
  local_170 = (Alloc *)a2b;
  local_158._48_8_ = local_68;
  local_60 = pvVar4;
  local_48 = __return_storage_ptr__;
  pppAVar10 = (Alloc ***)std::__cxx11::string::_M_create((ulong *)&local_198,(ulong)&local_1c0);
  ppAVar13 = local_1c0;
  local_188 = local_1c0;
  local_198 = pppAVar10;
  memcpy(pppAVar10,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_190 = ppAVar13;
  *(undefined1 *)((long)pppAVar10 + (long)ppAVar13) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_198);
  local_168 = (Alloc *)local_158;
  pAVar16 = (Alloc *)(plVar11 + 2);
  plVar8 = (long *)(local_200 + 0x10);
  if ((Alloc *)*plVar11 == pAVar16) {
    local_158._0_8_ = pAVar16->size;
    local_158._8_8_ = plVar11[3];
  }
  else {
    local_158._0_8_ = pAVar16->size;
    local_168 = (Alloc *)*plVar11;
  }
  local_160 = (void *)plVar11[1];
  *plVar11 = (long)pAVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct((ulong)&local_1c0,'\x02');
  *(undefined2 *)local_1c0 = 0x3438;
  pAVar16 = (Alloc *)0xf;
  if (local_168 != (Alloc *)local_158) {
    pAVar16 = (Alloc *)local_158._0_8_;
  }
  if (pAVar16 < (Alloc *)((long)local_1b8 + (long)local_160)) {
    pAVar16 = (Alloc *)0xf;
    if (local_1c0 != local_1b0) {
      pAVar16 = local_1b0[0];
    }
    if (pAVar16 < (Alloc *)((long)local_1b8 + (long)local_160)) goto LAB_002fa7ac;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_168);
  }
  else {
LAB_002fa7ac:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_1c0);
  }
  psVar1 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar1) {
    local_200._16_8_ = *psVar1;
    local_200._24_8_ = puVar9[3];
    local_200._0_8_ = plVar8;
  }
  else {
    local_200._16_8_ = *psVar1;
    local_200._0_8_ = (size_type *)*puVar9;
  }
  local_200._8_8_ = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(char *)psVar1 = '\0';
  begin_code("parallel_for",(char *)local_200._0_8_);
  if ((long *)local_200._0_8_ != plVar8) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,(ulong)((long)&local_1b0[0]->size + 1));
  }
  name = local_110;
  local_178 = local_178 >> 2;
  if (local_168 != (Alloc *)local_158) {
    operator_delete(local_168,(ulong)((long)(size_t *)local_158._0_8_ + 1));
  }
  iVar7 = (int)local_178;
  if (local_198 != &local_188) {
    operator_delete(local_198,(long)local_188 + 1);
    iVar7 = (int)local_178;
  }
  if (0 < iVar7) {
    pAVar16 = (Alloc *)local_158._48_8_;
    if ((local_158._48_8_ & 7) == 0 && (Alloc *)local_158._48_8_ != (Alloc *)0x0) {
      pAVar16 = (Alloc *)(*(size_t *)local_158._48_8_ * 8 + 1);
    }
    if (((ulong)pAVar15 & 7) == 0 && pAVar15 != (Alloc *)0x0) {
      pAVar15->use_count = pAVar15->use_count + -1;
      pAVar15 = (Alloc *)(pAVar15->size * 8 + 1);
    }
    local_58 = (Alloc *)0x0;
    pvStack_50 = (void *)0x0;
    entering_parallel = '\0';
    lVar12 = 0;
    do {
      piVar2 = (int *)((long)pvVar6 + (long)*(int *)((long)pvVar4 + lVar12 * 4) * 4);
      *piVar2 = *piVar2 + 1;
      lVar12 = lVar12 + 1;
    } while (iVar7 != (int)lVar12);
    if (((ulong)pAVar15 & 7) == 0 && pAVar15 != (Alloc *)0x0) {
      piVar2 = &pAVar15->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(pAVar15);
        operator_delete(pAVar15,0x48);
      }
    }
    if (((ulong)pAVar16 & 7) == 0 && pAVar16 != (Alloc *)0x0) {
      piVar2 = &pAVar16->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(pAVar16);
        operator_delete(pAVar16,0x48);
      }
    }
  }
  ScopedTimer::~ScopedTimer((ScopedTimer *)&local_d8);
  local_78.shared_alloc_.alloc = local_e8.shared_alloc_.alloc;
  i = (LO)local_120;
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_78.shared_alloc_.alloc = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_78.shared_alloc_.direct_ptr = local_e8.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_40,&local_78);
  offset_scan<int>((Omega_h *)&local_108,(Read<int> *)&local_40,name);
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_40.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(local_40.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar15 = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_78.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_78.shared_alloc_.alloc);
      operator_delete(pAVar15,0x48);
    }
  }
  iVar7 = Read<int>::get(&local_108,i);
  Write<int>::Write(&local_f8,iVar7,(string *)local_118);
  local_200._0_8_ = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"");
  Write<int>::Write(&local_88,i,0,(string *)local_200);
  if ((long *)local_200._0_8_ != plVar8) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  pvVar4 = local_f8.shared_alloc_.direct_ptr;
  pvVar6 = local_108.write_.shared_alloc_.direct_ptr;
  local_168 = (((Write<int> *)&local_170->size)->shared_alloc_).alloc;
  if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168 = (Alloc *)(local_168->size * 8 + 1);
    }
    else {
      local_168->use_count = local_168->use_count + 1;
    }
  }
  local_160 = (((Write<int> *)&local_170->size)->shared_alloc_).direct_ptr;
  local_158._0_8_ = local_108.write_.shared_alloc_.alloc;
  if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
      local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158._0_8_ = (local_108.write_.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_108.write_.shared_alloc_.alloc)->use_count =
           (local_108.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_158._8_8_ = local_108.write_.shared_alloc_.direct_ptr;
  local_158._16_8_ = local_88.shared_alloc_.alloc;
  if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 && local_88.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_158._16_8_ = (local_88.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_88.shared_alloc_.alloc)->use_count = (local_88.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_158._24_8_ = local_88.shared_alloc_.direct_ptr;
  local_158._32_8_ = local_f8.shared_alloc_.alloc;
  if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 && local_f8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_158._32_8_ = (local_f8.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_158._40_8_ = local_f8.shared_alloc_.direct_ptr;
  local_1c0 = local_1b0;
  local_d8 = (Alloc *)0x5d;
  local_170 = (Alloc *)local_158._32_8_;
  local_158._48_8_ = local_158._16_8_;
  local_120 = (Alloc *)local_158._0_8_;
  local_118 = local_168;
  local_110 = (string *)local_160;
  ppAVar13 = (Alloc **)std::__cxx11::string::_M_create((ulong *)&local_1c0,(ulong)&local_d8);
  pAVar15 = local_d8;
  local_1b0[0] = local_d8;
  local_1c0 = ppAVar13;
  memcpy(ppAVar13,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_1b8 = pAVar15;
  *(undefined1 *)((long)ppAVar13 + (long)pAVar15) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  pppAVar10 = (Alloc ***)(plVar8 + 2);
  if ((Alloc ***)*plVar8 == pppAVar10) {
    local_188 = *pppAVar10;
    lStack_180 = plVar8[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *pppAVar10;
    local_198 = (Alloc ***)*plVar8;
  }
  local_190 = (Alloc **)plVar8[1];
  *plVar8 = (long)pppAVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_d8 = (Alloc *)local_c8;
  std::__cxx11::string::_M_construct((ulong)&local_d8,'\x02');
  *(undefined2 *)&local_d8->size = 0x3438;
  ppAVar13 = (Alloc **)0xf;
  if (local_198 != &local_188) {
    ppAVar13 = local_188;
  }
  if (ppAVar13 < (Alloc **)(local_d0 + (long)local_190)) {
    ppAVar13 = (Alloc **)0xf;
    if (local_d8 != (Alloc *)local_c8) {
      ppAVar13 = (Alloc **)local_c8._0_8_;
    }
    if ((Alloc **)(local_d0 + (long)local_190) <= ppAVar13) {
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_d8,0,(char *)0x0,(ulong)local_198);
      goto LAB_002fadbf;
    }
  }
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_d8);
LAB_002fadbf:
  local_200._0_8_ = local_200 + 0x10;
  pAVar15 = (Alloc *)(plVar8 + 2);
  if ((Alloc *)*plVar8 == pAVar15) {
    local_200._16_8_ = pAVar15->size;
    local_200._24_8_ = plVar8[3];
  }
  else {
    local_200._16_8_ = pAVar15->size;
    local_200._0_8_ = (Alloc *)*plVar8;
  }
  local_200._8_8_ = plVar8[1];
  *plVar8 = (long)pAVar15;
  plVar8[1] = 0;
  *(undefined1 *)&pAVar15->size = 0;
  begin_code("parallel_for",(char *)local_200._0_8_);
  if ((Alloc *)local_200._0_8_ != (Alloc *)(local_200 + 0x10)) {
    operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
  }
  if (local_d8 != (Alloc *)local_c8) {
    operator_delete(local_d8,local_c8._0_8_ + 1);
  }
  this = local_48;
  if (local_198 != &local_188) {
    operator_delete(local_198,(long)local_188 + 1);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,(ulong)((long)&local_1b0[0]->size + 1));
  }
  if (0 < (int)local_178) {
    local_200._0_8_ = local_118;
    if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
      local_200._0_8_ = local_118->size * 8 + 1;
    }
    local_200._8_8_ = local_110;
    local_200._16_8_ = local_120;
    if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
      local_200._16_8_ = local_120->size * 8 + 1;
    }
    local_200._24_8_ = pvVar6;
    local_1e0 = (Alloc *)local_158._48_8_;
    if ((local_158._48_8_ & 7) == 0 && (Alloc *)local_158._48_8_ != (Alloc *)0x0) {
      local_1e0 = (Alloc *)(*(size_t *)local_158._48_8_ * 8 + 1);
    }
    local_1d8 = local_88.shared_alloc_.direct_ptr;
    local_1d0 = local_170;
    local_1c8 = (Alloc *)pvVar4;
    if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
      local_170->use_count = local_170->use_count + -1;
      local_1d0 = (Alloc *)(local_170->size * 8 + 1);
    }
    local_158._32_8_ = (Alloc *)0x0;
    local_158._40_8_ = (Alloc *)0x0;
    entering_parallel = '\0';
    lVar12 = 0;
    do {
      lVar14 = (long)*(int *)((long)local_110 + lVar12 * 4);
      iVar7 = *(int *)((long)pvVar6 + lVar14 * 4);
      iVar3 = *(int *)((long)local_88.shared_alloc_.direct_ptr + lVar14 * 4);
      *(int *)((long)local_88.shared_alloc_.direct_ptr + lVar14 * 4) = iVar3 + 1;
      *(int *)((long)(size_t *)pvVar4 + ((long)iVar7 + (long)iVar3) * 4) = (int)lVar12;
      lVar12 = lVar12 + 1;
    } while ((int)local_178 != (int)lVar12);
    invert_map_by_atomics(Omega_h::Read<int>,int,std::__cxx11::string_const&,std::__cxx11::string_const&)
    ::$_1::~__1((__1 *)local_200);
  }
  ScopedTimer::~ScopedTimer(&local_199);
  local_98.shared_alloc_.alloc = local_f8.shared_alloc_.alloc;
  if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 && local_f8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_98.shared_alloc_.alloc = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_98.shared_alloc_.direct_ptr = local_f8.shared_alloc_.direct_ptr;
  Read<int>::Read((Read<signed_char> *)local_200,&local_98);
  pAVar15 = local_98.shared_alloc_.alloc;
  if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 && local_98.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_98.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_98.shared_alloc_.alloc);
      operator_delete(pAVar15,0x48);
    }
  }
  local_c8._16_8_ = local_108.write_.shared_alloc_.alloc;
  if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
      local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8._16_8_ = (local_108.write_.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_108.write_.shared_alloc_.alloc)->use_count =
           (local_108.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b0._0_8_ = local_108.write_.shared_alloc_.direct_ptr;
  local_b0._8_8_ = local_200._0_8_;
  if ((local_200._0_8_ & 7) == 0 && (Alloc *)local_200._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0._8_8_ = *(long *)local_200._0_8_ * 8 + 1;
    }
    else {
      *(int *)(local_200._0_8_ + 0x30) = *(int *)(local_200._0_8_ + 0x30) + 1;
    }
  }
  local_a0 = (void *)local_200._8_8_;
  Graph::Graph(this,(LOs *)(local_c8 + 0x10),(LOs *)(local_b0 + 8));
  uVar5 = local_b0._8_8_;
  if ((local_b0._8_8_ & 7) == 0 && (Alloc *)local_b0._8_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_b0._8_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)uVar5);
      operator_delete((void *)uVar5,0x48);
    }
  }
  uVar5 = local_c8._16_8_;
  if ((local_c8._16_8_ & 7) == 0 && (Alloc *)local_c8._16_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_c8._16_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_c8._16_8_);
      operator_delete((void *)uVar5,0x48);
    }
  }
  uVar5 = local_200._0_8_;
  if ((local_200._0_8_ & 7) == 0 && (Alloc *)local_200._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_200._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_200._0_8_);
      operator_delete((void *)uVar5,0x48);
    }
  }
  invert_map_by_atomics(Omega_h::Read<int>,int,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::$_1::~__1((__1 *)&local_168);
  if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 && local_88.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_88.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_88.shared_alloc_.alloc);
      operator_delete(local_88.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 && local_f8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_f8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_f8.shared_alloc_.alloc);
      operator_delete(local_f8.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
      local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_108.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_108.write_.shared_alloc_.alloc);
      operator_delete(local_108.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar15 = local_58;
  if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
    piVar2 = &local_58->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_58);
      operator_delete(pAVar15,0x48);
    }
  }
  pAVar15 = local_68;
  if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
    piVar2 = &local_68->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_68);
      operator_delete(pAVar15,0x48);
    }
  }
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_e8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_e8.shared_alloc_.alloc);
      operator_delete(local_e8.shared_alloc_.alloc,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_201);
  return this;
}

Assistant:

Graph invert_map_by_atomics(LOs const a2b, LO const nb,
    std::string const& b2ba_name, std::string const& ba2a_name) {
  OMEGA_H_TIME_FUNCTION;
  auto const na = a2b.size();
  Write<LO> degrees(nb, 0);
  auto count = OMEGA_H_LAMBDA(LO a) {
    auto const b = a2b[a];
    atomic_increment(&degrees[b]);
  };
  parallel_for(na, std::move(count));
  auto const b2ba = offset_scan(Read<LO>(degrees), b2ba_name);
  auto const nba = b2ba.get(nb);
  Write<LO> write_ba2a(nba, ba2a_name);
  auto const positions = Write<LO>(nb, 0);
  auto fill = OMEGA_H_LAMBDA(LO a) {
    auto const b = a2b[a];
    auto const first = b2ba[b];
    auto const j = atomic_fetch_add(&positions[b], 1);
    write_ba2a[first + j] = a;
  };
  parallel_for(na, std::move(fill));
  auto const ba2a = LOs(write_ba2a);
  return Graph(b2ba, ba2a);
}